

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.cpp
# Opt level: O1

void UnitTest::anon_unknown_1::CheckStringsEqual
               (TestResults *results,char *expected,char *actual,TestDetails *details)

{
  int iVar1;
  size_t sVar2;
  char *failure;
  MemoryOutStream stream;
  undefined1 auStack_1c8 [8];
  undefined1 local_1c0 [408];
  
  iVar1 = strcmp(expected,actual);
  if (iVar1 != 0) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    if (expected == (char *)0x0) {
      std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18) + 8);
    }
    else {
      sVar2 = strlen(expected);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,expected,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," but was ",9);
    if (actual == (char *)0x0) {
      std::ios::clear((int)auStack_1c8 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18) + 8);
    }
    else {
      sVar2 = strlen(actual);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,actual,sVar2);
    }
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckStringsEqual(TestResults& results, char const* expected, char const* actual, 
                       TestDetails const& details)
{
	using namespace std;

    if (strcmp(expected, actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}